

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTetra>::TPZCompElHDiv
          (TPZCompElHDiv<pzshape::TPZShapeTetra> *this,TPZCompMesh *mesh,
          TPZCompElHDiv<pzshape::TPZShapeTetra> *copy,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcConMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  ostream *poVar5;
  char *pcVar6;
  long lVar7;
  long in_RDX;
  TPZRegisterClassId *in_RDI;
  stringstream sout;
  int glIdx;
  int lcIdx;
  int i;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffd48;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffd68;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffd70;
  TPZIntelGen<pzshape::TPZShapeTetra> *in_stack_fffffffffffffd78;
  TPZCompMesh *in_stack_fffffffffffffd80;
  void **in_stack_fffffffffffffd88;
  TPZIntelGen<pzshape::TPZShapeTetra> *in_stack_fffffffffffffd90;
  string local_228 [32];
  stringstream local_208 [16];
  ostream local_1f8 [376];
  long local_80;
  _Self local_78;
  long local_70;
  _Self local_68;
  int local_5c;
  int local_58;
  int local_54;
  undefined8 local_50;
  undefined8 local_38;
  undefined8 local_30;
  long local_18;
  
  local_30 = 0;
  local_38 = 0x21;
  local_18 = in_RDX;
  TPZRegisterClassId::TPZRegisterClassId<TPZCompElHDiv<pzshape::TPZShapeTetra>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024bc820);
  TPZIntelGen<pzshape::TPZShapeTetra>::TPZIntelGen
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
             in_stack_fffffffffffffd78,in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  *(undefined ***)in_RDI = &PTR__TPZCompElHDiv_024bc400;
  *(undefined ***)in_RDI = &PTR__TPZCompElHDiv_024bc400;
  TPZManVector<int,_4>::TPZManVector
            ((TPZManVector<int,_4> *)in_stack_fffffffffffffd80,
             (TPZManVector<int,_4> *)in_stack_fffffffffffffd78);
  std::__cxx11::list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_>::list
            ((list<TPZOneShapeRestraint,_std::allocator<TPZOneShapeRestraint>_> *)0x1a0ccf2);
  local_50 = 0xffffffffffffffff;
  TPZManVector<long,_5>::TPZManVector
            ((TPZManVector<long,_5> *)in_stack_fffffffffffffd80,(int64_t)in_stack_fffffffffffffd78,
             (long *)in_stack_fffffffffffffd70);
  *(undefined4 *)(in_RDI + 0xd8) = *(undefined4 *)(local_18 + 0xd8);
  *(undefined4 *)(in_RDI + 0x28) = *(undefined4 *)(local_18 + 0x28);
  local_54 = 0;
  while( true ) {
    iVar1 = local_54;
    iVar3 = (**(code **)(*(long *)in_RDI + 0x90))();
    if (iVar3 <= iVar1) {
      return;
    }
    local_58 = 0xffffffff;
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(local_18 + 0x90),(long)local_54);
    local_5c = (int)*plVar4;
    local_70 = (long)local_5c;
    local_68._M_node =
         (_Base_ptr)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::find
                   (in_stack_fffffffffffffd48,(key_type_conflict1 *)0x1a0cdf1);
    local_78._M_node =
         (_Base_ptr)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                   (in_stack_fffffffffffffd48);
    bVar2 = std::operator!=(&local_68,&local_78);
    if (!bVar2) break;
    local_80 = (long)local_5c;
    in_stack_fffffffffffffd90 =
         (TPZIntelGen<pzshape::TPZShapeTetra> *)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                     *)in_stack_fffffffffffffd90,(key_type_conflict1 *)in_stack_fffffffffffffd88);
    local_58 = (int)*(mapped_type_conflict *)
                     &(in_stack_fffffffffffffd90->super_TPZInterpolatedElement).
                      super_TPZInterpolationSpace.super_TPZCompEl;
    lVar7 = (long)local_58;
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x90),(long)local_54);
    *plVar4 = lVar7;
    local_54 = local_54 + 1;
  }
  std::__cxx11::stringstream::stringstream(local_208);
  poVar5 = std::operator<<(local_1f8,"ERROR in : ");
  poVar5 = std::operator<<(poVar5,
                           "TPZCompElHDiv<pzshape::TPZShapeTetra>::TPZCompElHDiv(TPZCompMesh &, const TPZCompElHDiv<TSHAPE> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TSHAPE = pzshape::TPZShapeTetra]"
                          );
  poVar5 = std::operator<<(poVar5," trying to clone the connect index: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_5c);
  std::operator<<(poVar5," wich is not in mapped connect indexes!");
  std::__cxx11::stringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  poVar5 = std::operator<<((ostream *)&std::cout,pcVar6);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_228);
  plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x90),(long)local_54);
  *plVar4 = -1;
  std::__cxx11::stringstream::~stringstream(local_208);
  return;
}

Assistant:

TPZCompElHDiv<TSHAPE>::TPZCompElHDiv(TPZCompMesh &mesh,
									 const TPZCompElHDiv<TSHAPE> &copy,
									 std::map<int64_t,int64_t> & gl2lcConMap,
									 std::map<int64_t,int64_t> & gl2lcElMap) :
TPZRegisterClassId(&TPZCompElHDiv::ClassId),
TPZIntelGen<TSHAPE>(mesh,copy,gl2lcConMap,gl2lcElMap), fSideOrient(copy.fSideOrient), fhdivfam(copy.fhdivfam)
{
	this-> fPreferredOrder = copy.fPreferredOrder;
	int i;
	for(i=0;i<NConnects();i++)
	{
		int lcIdx = -1;
		int glIdx = copy.fConnectIndexes[i];
		if (gl2lcConMap.find(glIdx) != gl2lcConMap.end()) lcIdx = gl2lcConMap[glIdx];
		else
		{
			std::stringstream sout;
			sout << "ERROR in : " << __PRETTY_FUNCTION__
			<< " trying to clone the connect index: " << glIdx
			<< " wich is not in mapped connect indexes!";
			LOGPZ_ERROR(logger, sout.str().c_str());
			this-> fConnectIndexes[i] = -1;
			return;
		}
		this-> fConnectIndexes[i] = lcIdx;
	}
}